

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FrameTranslator.cpp
# Opt level: O3

Expression * __thiscall IRT::FrameTranslator::GetField(FrameTranslator *this,string *name)

{
  pointer pcVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  mapped_type *pmVar5;
  undefined4 extraout_var;
  ClassStorage *pCVar6;
  mapped_type *pmVar7;
  runtime_error *this_00;
  MemExpression *this_01;
  BinopExpression *this_02;
  ConstExpression *this_03;
  _Elt_pointer ppAVar8;
  pointer this_04;
  bool bVar9;
  vector<Symbol,_std::allocator<Symbol>_> field_names;
  undefined1 local_100 [56];
  string *local_c8;
  string local_c0;
  Expression *local_a0;
  Symbol *local_98;
  FrameTranslator *local_90;
  Symbol local_88;
  vector<Symbol,_std::allocator<Symbol>_> local_68;
  string local_50;
  
  local_100._0_8_ = local_100 + 0x10;
  local_c8 = name;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"this","");
  pmVar5 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->addresses_,(key_type *)local_100);
  ppAVar8 = (pmVar5->c).super__Deque_base<IRT::Address_*,_std::allocator<IRT::Address_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar8 ==
      (pmVar5->c).super__Deque_base<IRT::Address_*,_std::allocator<IRT::Address_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppAVar8 = (pmVar5->c).super__Deque_base<IRT::Address_*,_std::allocator<IRT::Address_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  iVar3 = (*ppAVar8[-1]->_vptr_Address[2])();
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  pCVar6 = ClassStorage::GetInstance();
  pcVar1 = (this->class_name_)._M_dataplus._M_p;
  local_90 = this;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (this->class_name_)._M_string_length);
  Symbol::Symbol((Symbol *)local_100,&local_50);
  ClassStorage::GetFieldsNames(&local_68,pCVar6,(Symbol *)local_100);
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  local_a0 = (Expression *)CONCAT44(extraout_var,iVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_98 = local_68.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_68.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_68.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    iVar3 = 0;
    this_04 = local_68.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      Symbol::GetName_abi_cxx11_((string *)local_100,this_04);
      uVar2 = local_100._0_8_;
      if (local_100._8_8_ == local_c8->_M_string_length) {
        if (local_100._8_8_ == 0) {
          bVar9 = true;
        }
        else {
          iVar4 = bcmp((void *)local_100._0_8_,(local_c8->_M_dataplus)._M_p,local_100._8_8_);
          bVar9 = iVar4 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if ((undefined1 *)uVar2 != local_100 + 0x10) {
        operator_delete((void *)uVar2,local_100._16_8_ + 1);
      }
      if (bVar9) {
        this_01 = (MemExpression *)operator_new(0x10);
        this_02 = (BinopExpression *)operator_new(0x20);
        this_03 = (ConstExpression *)operator_new(0x10);
        ConstExpression::ConstExpression(this_03,iVar3);
        BinopExpression::BinopExpression(this_02,PLUS,local_a0,(Expression *)this_03);
        MemExpression::MemExpression(this_01,(Expression *)this_02);
        std::vector<Symbol,_std::allocator<Symbol>_>::~vector(&local_68);
        return &this_01->super_Expression;
      }
      pCVar6 = ClassStorage::GetInstance();
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      pcVar1 = (local_90->class_name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,pcVar1,pcVar1 + (local_90->class_name_)._M_string_length);
      Symbol::Symbol(&local_88,&local_c0);
      ClassStorage::GetFields
                ((unordered_map<Symbol,_std::shared_ptr<PrimitiveObject>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>_>
                  *)local_100,pCVar6,&local_88);
      pmVar7 = std::__detail::
               _Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)local_100,this_04);
      iVar4 = (*(((pmVar7->super___shared_ptr<PrimitiveObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                ->super_Object)._vptr_Object[3])();
      std::
      _Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.name_._M_dataplus._M_p != &local_88.name_.field_2) {
        operator_delete(local_88.name_._M_dataplus._M_p,
                        local_88.name_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      iVar3 = iVar3 + iVar4;
      this_04 = this_04 + 1;
    } while (this_04 != local_98);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                 "Undeclared field: ",local_c8);
  std::runtime_error::runtime_error(this_00,(string *)local_100);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

IRT::Expression* FrameTranslator::GetField(const std::string& name) {
  IRT::Expression* this_ptr = addresses_["this"].top()->ToExpression();
  IRT::Expression* field_ptr;

  auto field_names =
      ClassStorage::GetInstance().GetFieldsNames(Symbol(class_name_));
  bool is_found = false;
  size_t offset = 0;

  for (auto&& field : field_names) {
    if (field.GetName() == name) {
      is_found = true;
      break;
    }
    offset += ClassStorage::GetInstance()
                  .GetFields(Symbol(class_name_))[field]
                  ->GetSize();
  }
  if (is_found) {
    field_ptr = new MemExpression(new BinopExpression(
        BinaryOperatorType::PLUS, this_ptr, new ConstExpression(offset)));
  } else {
    throw std::runtime_error("Undeclared field: " + name);
  }

  return field_ptr;
}